

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  char __tmp;
  ulong n;
  size_t __len;
  size_t __n;
  size_t __len_1;
  checked_ptr<typename_buffer<char>::value_type> pcVar4;
  checked_ptr<typename_buffer<char>::value_type> local_30;
  
  n = (ulong)(uint)specs->width;
  uVar2 = 4 - (ulong)(f->sign == none);
  __n = n - uVar2;
  if (n < uVar2 || __n == 0) {
    local_30 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,
                          uVar2);
    nonfinite_writer<char>::operator()(f,&local_30);
  }
  else {
    local_30 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,n);
    bVar1 = (specs->fill).data_[0];
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      uVar2 = __n >> 1 & 0x7fffffff;
      pcVar4 = local_30;
      if (1 < __n) {
        pcVar4 = local_30 + uVar2;
        switchD_0049f7f1::default(local_30,(uint)bVar1,uVar2);
      }
      local_30 = pcVar4;
      nonfinite_writer<char>::operator()(f,&local_30);
      __n = __n - uVar2;
    }
    else {
      if (bVar3 == 2) {
        pcVar4 = local_30 + __n;
        switchD_0049f7f1::default(local_30,(uint)bVar1,__n);
        local_30 = pcVar4;
        nonfinite_writer<char>::operator()(f,&local_30);
        return;
      }
      nonfinite_writer<char>::operator()(f,&local_30);
    }
    switchD_0049f7f1::default(local_30,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }